

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

int run_test_loop_handles(void)

{
  int iVar1;
  int extraout_EAX;
  uv_timer_t *loop;
  uv_loop_t *loop_00;
  long lVar2;
  uv_prepare_t *puVar3;
  uv_check_t *puVar4;
  
  loop = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_prepare_init((uv_loop_t *)loop,&prepare_1_handle);
  if (iVar1 == 0) {
    puVar3 = &prepare_1_handle;
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    loop = (uv_timer_t *)puVar3;
    if (iVar1 != 0) goto LAB_001613b0;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init((uv_loop_t *)loop,&check_handle);
    if (iVar1 != 0) goto LAB_001613b5;
    puVar4 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    loop = (uv_timer_t *)puVar4;
    if (iVar1 != 0) goto LAB_001613ba;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_prepare_init((uv_loop_t *)loop,&prepare_2_handle);
    if (iVar1 != 0) goto LAB_001613bf;
    lVar2 = 0;
    do {
      loop = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_idle_init((uv_loop_t *)loop,
                           (uv_idle_t *)((long)idle_1_handles[0].handle_queue + lVar2 + -0x20));
      if (iVar1 != 0) {
        run_test_loop_handles_cold_6();
        goto LAB_001613ab;
      }
      lVar2 = lVar2 + 0x78;
    } while (lVar2 != 0x348);
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timer_handle);
    if (iVar1 != 0) goto LAB_001613c4;
    loop = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,100,100);
    if (iVar1 != 0) goto LAB_001613c9;
    uv_unref((uv_handle_t *)&timer_handle);
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001613ce;
    if (loop_iteration != 0x15) goto LAB_001613d3;
    if (prepare_1_cb_called != 0x15) goto LAB_001613d8;
    if (prepare_1_close_cb_called != 1) goto LAB_001613dd;
    if (prepare_2_cb_called != 10) goto LAB_001613e2;
    if (prepare_2_close_cb_called != 1) goto LAB_001613e7;
    if (check_cb_called != 0x15) goto LAB_001613ec;
    if (check_close_cb_called != 1) goto LAB_001613f1;
    if (idle_1_close_cb_called != 7) goto LAB_001613f6;
    if (idle_2_close_cb_called != idle_2_cb_started) goto LAB_001613fb;
    if (idle_2_is_active != '\x01') {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00161405;
    }
  }
  else {
LAB_001613ab:
    run_test_loop_handles_cold_1();
LAB_001613b0:
    run_test_loop_handles_cold_2();
LAB_001613b5:
    run_test_loop_handles_cold_3();
LAB_001613ba:
    run_test_loop_handles_cold_4();
LAB_001613bf:
    run_test_loop_handles_cold_5();
LAB_001613c4:
    run_test_loop_handles_cold_7();
LAB_001613c9:
    run_test_loop_handles_cold_8();
LAB_001613ce:
    run_test_loop_handles_cold_9();
LAB_001613d3:
    run_test_loop_handles_cold_10();
LAB_001613d8:
    run_test_loop_handles_cold_11();
LAB_001613dd:
    run_test_loop_handles_cold_12();
LAB_001613e2:
    run_test_loop_handles_cold_13();
LAB_001613e7:
    run_test_loop_handles_cold_14();
LAB_001613ec:
    run_test_loop_handles_cold_15();
LAB_001613f1:
    run_test_loop_handles_cold_16();
LAB_001613f6:
    run_test_loop_handles_cold_17();
LAB_001613fb:
    run_test_loop_handles_cold_18();
  }
  run_test_loop_handles_cold_20();
LAB_00161405:
  run_test_loop_handles_cold_19();
  if (loop == &timer_handle) {
    return 0x3271d8;
  }
  timer_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT(r == 0);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT(r == 0);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop_iteration == ITERATIONS);

  ASSERT(prepare_1_cb_called == ITERATIONS);
  ASSERT(prepare_1_close_cb_called == 1);

  ASSERT(prepare_2_cb_called == ITERATIONS / 2);
  ASSERT(prepare_2_close_cb_called == 1);

  ASSERT(check_cb_called == ITERATIONS);
  ASSERT(check_close_cb_called == 1);

  /* idle_1_cb should be called a lot */
  ASSERT(idle_1_close_cb_called == IDLE_COUNT);

  ASSERT(idle_2_close_cb_called == idle_2_cb_started);
  ASSERT(idle_2_is_active == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}